

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t FSE_decompress_wksp_bmi2
                 (void *dst,size_t dstCapacity,void *cSrc,size_t cSrcSize,uint maxLog,
                 void *workSpace,size_t wkspSize,int bmi2)

{
  byte bVar1;
  FSE_DTable *pFVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  uint uVar8;
  undefined1 *puVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 *puVar15;
  bool bVar16;
  FSE_DState_t state1;
  uint tableLog;
  BIT_DStream_t local_a8;
  FSE_DTable *local_80;
  undefined1 *local_78;
  long local_70;
  FSE_DState_t local_68;
  FSE_DState_t local_58;
  uint local_48;
  uint local_44;
  void *local_40;
  
  if (bmi2 != 0) {
    sVar7 = FSE_decompress_wksp_body_bmi2(dst,dstCapacity,cSrc,cSrcSize,maxLog,workSpace,wkspSize);
    return sVar7;
  }
  local_48 = 0xff;
  if (wkspSize < 0x204) {
    return 0xffffffffffffffff;
  }
  local_78 = (undefined1 *)cSrcSize;
  local_40 = dst;
  sVar7 = FSE_readNCount_bmi2((short *)workSpace,&local_48,&local_44,cSrc,cSrcSize,0);
  if (sVar7 < 0xffffffffffffff89) {
    if (local_44 <= maxLog) {
      cSrc = (void *)((long)cSrc + sVar7);
      puVar9 = (undefined1 *)((long)local_78 - sVar7);
      bVar16 = true;
      goto LAB_00156850;
    }
    sVar7 = 0xffffffffffffffd4;
  }
  bVar16 = false;
  puVar9 = local_78;
LAB_00156850:
  if (!bVar16) {
    return sVar7;
  }
  lVar12 = (long)(1 << ((byte)local_44 & 0x1f));
  if (wkspSize <
      ((1L << ((byte)local_44 & 0x3f)) + (ulong)(local_48 + 1) * 2 + lVar12 * 4 + 0x13 &
      0xfffffffffffffffc) + 0x204) {
    return 0xffffffffffffffd4;
  }
  local_80 = (FSE_DTable *)((long)workSpace + 0x200);
  sVar7 = FSE_buildDTable_internal
                    (local_80,(short *)workSpace,local_48,local_44,
                     (void *)(lVar12 * 4 + 0x208 + (long)workSpace),
                     (wkspSize - (lVar12 * 4 + 4)) - 0x204);
  pvVar3 = local_40;
  pFVar2 = local_80;
  if (0xffffffffffffff88 < sVar7) {
    return sVar7;
  }
  local_70 = (long)local_40 + dstCapacity;
  local_78 = (undefined1 *)((long)local_40 + (dstCapacity - 3));
  if (*(short *)((long)workSpace + 0x202) == 0) {
    sVar7 = BIT_initDStream(&local_a8,cSrc,(size_t)puVar9);
    pFVar2 = local_80;
    if (0xffffffffffffff88 < sVar7) {
      return sVar7;
    }
    FSE_initDState(&local_58,&local_a8,local_80);
    FSE_initDState(&local_68,&local_a8,pFVar2);
    puVar9 = (undefined1 *)((long)local_40 + 1);
    do {
      iVar4 = (int)local_a8.start;
      if (local_a8.bitsConsumed < 0x41) {
        if (local_a8.ptr < local_a8.limitPtr) {
          if (local_a8.ptr == local_a8.start) goto LAB_00156a03;
          bVar16 = local_a8.start <=
                   (ulong *)((long)local_a8.ptr - (ulong)(local_a8.bitsConsumed >> 3));
          uVar6 = (int)local_a8.ptr - iVar4;
          if (bVar16) {
            uVar6 = local_a8.bitsConsumed >> 3;
          }
          local_a8.bitsConsumed = local_a8.bitsConsumed + uVar6 * -8;
        }
        else {
          uVar6 = local_a8.bitsConsumed >> 3;
          local_a8.bitsConsumed = local_a8.bitsConsumed & 7;
          bVar16 = true;
        }
        local_a8.ptr = (char *)((long)local_a8.ptr - (ulong)uVar6);
        local_a8.bitContainer = *(size_t *)local_a8.ptr;
      }
      else {
LAB_00156a03:
        bVar16 = false;
      }
      puVar15 = puVar9 + -1;
      if ((local_78 <= puVar15) || (!bVar16)) goto LAB_00156c08;
      bVar1 = *(byte *)((long)local_58.table + local_58.state * 4 + 3);
      iVar4 = local_a8.bitsConsumed + bVar1;
      uVar14 = (ulong)*(ushort *)((long)local_58.table + local_58.state * 4);
      uVar13 = (-1L << (bVar1 & 0x3f) ^ 0xffffffffffffffffU) &
               local_a8.bitContainer >> (-(char)iVar4 & 0x3fU);
      puVar9[-1] = *(undefined1 *)((long)local_58.table + local_58.state * 4 + 2);
      bVar1 = *(byte *)((long)local_68.table + local_68.state * 4 + 3);
      iVar4 = iVar4 + (uint)bVar1;
      uVar11 = (ulong)*(ushort *)((long)local_68.table + local_68.state * 4);
      uVar10 = (-1L << (bVar1 & 0x3f) ^ 0xffffffffffffffffU) &
               local_a8.bitContainer >> (-(char)iVar4 & 0x3fU);
      *puVar9 = *(undefined1 *)((long)local_68.table + local_68.state * 4 + 2);
      bVar1 = *(byte *)((long)local_58.table + uVar14 * 4 + uVar13 * 4 + 3);
      iVar4 = iVar4 + (uint)bVar1;
      local_58.state =
           (~(-1L << (bVar1 & 0x3f)) & local_a8.bitContainer >> (-(char)iVar4 & 0x3fU)) +
           (ulong)*(ushort *)((long)local_58.table + uVar14 * 4 + uVar13 * 4);
      puVar9[1] = *(undefined1 *)((long)local_58.table + uVar14 * 4 + uVar13 * 4 + 2);
      bVar1 = *(byte *)((long)local_68.table + uVar11 * 4 + uVar10 * 4 + 3);
      local_a8.bitsConsumed = iVar4 + (uint)bVar1;
      local_68.state =
           (~(-1L << (bVar1 & 0x3f)) &
           local_a8.bitContainer >> (-(char)local_a8.bitsConsumed & 0x3fU)) +
           (ulong)*(ushort *)((long)local_68.table + uVar11 * 4 + uVar10 * 4);
      puVar9[2] = *(undefined1 *)((long)local_68.table + uVar11 * 4 + uVar10 * 4 + 2);
      puVar9 = puVar9 + 4;
    } while( true );
  }
  if (puVar9 == (undefined1 *)0x0) {
    local_a8.ptr = (char *)0x0;
    local_a8.start = (char *)0x0;
    local_a8.bitContainer = 0;
    local_a8.bitsConsumed = 0;
    local_a8._12_4_ = 0;
    local_a8.limitPtr = (char *)0x0;
    puVar9 = (undefined1 *)0xffffffffffffffb8;
  }
  else {
    local_a8.limitPtr = (char *)((long)cSrc + 8);
    local_a8.start = (char *)cSrc;
    if (puVar9 < 8) {
      local_a8.bitContainer = (size_t)(byte)*cSrc;
      switch(puVar9) {
      case (undefined1 *)0x7:
        local_a8.bitContainer = (ulong)*(byte *)((long)cSrc + 6) << 0x30 | local_a8.bitContainer;
      case (undefined1 *)0x6:
        local_a8.bitContainer = local_a8.bitContainer + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
      case (undefined1 *)0x5:
        local_a8.bitContainer = local_a8.bitContainer + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
      case (undefined1 *)0x4:
        local_a8.bitContainer = local_a8.bitContainer + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000
        ;
      case (undefined1 *)0x3:
        local_a8.bitContainer = local_a8.bitContainer + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
      case (undefined1 *)0x2:
        local_a8.bitContainer = local_a8.bitContainer + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
      default:
        bVar1 = *(byte *)((long)cSrc + ((long)puVar9 - 1U));
        uVar6 = 0x1f;
        if (bVar1 != 0) {
          for (; bVar1 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        local_a8.bitsConsumed = ~uVar6 + 9;
        if (bVar1 == 0) {
          local_a8.bitsConsumed = 0;
        }
        local_a8.ptr = (char *)cSrc;
        if (bVar1 == 0) {
          puVar9 = (undefined1 *)0xffffffffffffffec;
        }
        else {
          local_a8.bitsConsumed = local_a8.bitsConsumed + (int)puVar9 * -8 + 0x40;
        }
      }
    }
    else {
      local_a8.ptr = (char *)((long)cSrc + ((long)puVar9 - 8U));
      local_a8.bitContainer = *(size_t *)local_a8.ptr;
      bVar1 = *(byte *)((long)cSrc + ((long)puVar9 - 1U));
      uVar6 = 0x1f;
      if (bVar1 != 0) {
        for (; bVar1 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      local_a8.bitsConsumed = ~uVar6 + 9;
      if (bVar1 == 0) {
        local_a8.bitsConsumed = 0;
      }
      if (bVar1 == 0) {
        puVar9 = (undefined1 *)0xffffffffffffffff;
      }
    }
  }
  if (0xffffffffffffff88 < puVar9) {
    return (size_t)puVar9;
  }
  FSE_initDState(&local_58,&local_a8,local_80);
  FSE_initDState(&local_68,&local_a8,pFVar2);
  puVar9 = (undefined1 *)((long)pvVar3 + 1);
  do {
    iVar4 = (int)local_a8.start;
    if (local_a8.bitsConsumed < 0x41) {
      if (local_a8.ptr < local_a8.limitPtr) {
        if (local_a8.ptr == local_a8.start) goto LAB_00156ddc;
        bVar16 = local_a8.start <=
                 (ulong *)((long)local_a8.ptr - (ulong)(local_a8.bitsConsumed >> 3));
        uVar6 = (int)local_a8.ptr - iVar4;
        if (bVar16) {
          uVar6 = local_a8.bitsConsumed >> 3;
        }
        local_a8.bitsConsumed = local_a8.bitsConsumed + uVar6 * -8;
      }
      else {
        uVar6 = local_a8.bitsConsumed >> 3;
        local_a8.bitsConsumed = local_a8.bitsConsumed & 7;
        bVar16 = true;
      }
      local_a8.ptr = (char *)((long)local_a8.ptr - (ulong)uVar6);
      local_a8.bitContainer = *(size_t *)local_a8.ptr;
    }
    else {
LAB_00156ddc:
      bVar16 = false;
    }
    puVar15 = puVar9 + -1;
    if ((local_78 <= puVar15) || (!bVar16)) goto LAB_00156ede;
    bVar1 = *(byte *)((long)local_58.table + local_58.state * 4 + 3);
    iVar4 = local_a8.bitsConsumed + bVar1;
    uVar14 = (local_a8.bitContainer << ((byte)local_a8.bitsConsumed & 0x3f)) >> (-bVar1 & 0x3f);
    uVar11 = (ulong)*(ushort *)((long)local_58.table + local_58.state * 4);
    puVar9[-1] = *(undefined1 *)((long)local_58.table + local_58.state * 4 + 2);
    bVar1 = *(byte *)((long)local_68.table + local_68.state * 4 + 3);
    iVar5 = iVar4 + (uint)bVar1;
    uVar13 = (local_a8.bitContainer << ((byte)iVar4 & 0x3f)) >> (-bVar1 & 0x3f);
    uVar10 = (ulong)*(ushort *)((long)local_68.table + local_68.state * 4);
    *puVar9 = *(undefined1 *)((long)local_68.table + local_68.state * 4 + 2);
    bVar1 = *(byte *)((long)local_58.table + uVar11 * 4 + uVar14 * 4 + 3);
    iVar4 = iVar5 + (uint)bVar1;
    local_58.state =
         ((local_a8.bitContainer << ((byte)iVar5 & 0x3f)) >> (-bVar1 & 0x3f)) +
         (ulong)*(ushort *)((long)local_58.table + uVar11 * 4 + uVar14 * 4);
    puVar9[1] = *(undefined1 *)((long)local_58.table + uVar11 * 4 + uVar14 * 4 + 2);
    bVar1 = *(byte *)((long)local_68.table + uVar10 * 4 + uVar13 * 4 + 3);
    local_a8.bitsConsumed = iVar4 + (uint)bVar1;
    local_68.state =
         ((local_a8.bitContainer << ((byte)iVar4 & 0x3f)) >> (-bVar1 & 0x3f)) +
         (ulong)*(ushort *)((long)local_68.table + uVar10 * 4 + uVar13 * 4);
    puVar9[2] = *(undefined1 *)((long)local_68.table + uVar10 * 4 + uVar13 * 4 + 2);
    puVar9 = puVar9 + 4;
  } while( true );
LAB_00156c08:
  do {
    if ((undefined1 *)(local_70 + -2) < puVar15) {
      return 0xffffffffffffffba;
    }
    bVar1 = *(byte *)((long)local_58.table + local_58.state * 4 + 3);
    local_a8.bitsConsumed = local_a8.bitsConsumed + bVar1;
    lVar12 = local_58.state * 4;
    local_58.state =
         (~(-1L << (bVar1 & 0x3f)) & local_a8.bitContainer >> (-(char)local_a8.bitsConsumed & 0x3fU)
         ) + (ulong)*(ushort *)((long)local_58.table + local_58.state * 4);
    puVar9[-1] = *(undefined1 *)((long)local_58.table + lVar12 + 2);
    if (0x40 < local_a8.bitsConsumed) {
      *puVar9 = *(undefined1 *)((long)local_68.table + local_68.state * 4 + 2);
      puVar9 = puVar9 + 1;
      goto LAB_0015717a;
    }
    if (local_a8.ptr < local_a8.limitPtr) {
      if (local_a8.ptr != local_a8.start) {
        uVar6 = (int)local_a8.ptr - iVar4;
        if (local_a8.start <= (ulong *)((long)local_a8.ptr - (ulong)(local_a8.bitsConsumed >> 3))) {
          uVar6 = local_a8.bitsConsumed >> 3;
        }
        local_a8.bitsConsumed = local_a8.bitsConsumed + uVar6 * -8;
        goto LAB_00156cc8;
      }
    }
    else {
      uVar6 = local_a8.bitsConsumed >> 3;
      local_a8.bitsConsumed = local_a8.bitsConsumed & 7;
LAB_00156cc8:
      local_a8.ptr = (char *)((long)local_a8.ptr - (ulong)uVar6);
      local_a8.bitContainer = *(size_t *)local_a8.ptr;
    }
    if ((undefined1 *)(local_70 + -2) < puVar9) {
      return 0xffffffffffffffba;
    }
    bVar1 = *(byte *)((long)local_68.table + local_68.state * 4 + 3);
    local_a8.bitsConsumed = local_a8.bitsConsumed + bVar1;
    lVar12 = local_68.state * 4;
    local_68.state =
         (~(-1L << (bVar1 & 0x3f)) & local_a8.bitContainer >> (-(char)local_a8.bitsConsumed & 0x3fU)
         ) + (ulong)*(ushort *)((long)local_68.table + local_68.state * 4);
    *puVar9 = *(undefined1 *)((long)local_68.table + lVar12 + 2);
    if (0x40 < local_a8.bitsConsumed) {
      puVar9[1] = *(undefined1 *)((long)local_58.table + local_58.state * 4 + 2);
      puVar9 = puVar9 + 2;
LAB_0015717a:
      return (long)puVar9 - (long)local_40;
    }
    if (local_a8.ptr < local_a8.limitPtr) {
      if (local_a8.ptr != local_a8.start) {
        uVar6 = (int)local_a8.ptr - iVar4;
        if (local_a8.start <= (ulong *)((long)local_a8.ptr - (ulong)(local_a8.bitsConsumed >> 3))) {
          uVar6 = local_a8.bitsConsumed >> 3;
        }
        local_a8.bitsConsumed = local_a8.bitsConsumed + uVar6 * -8;
        goto LAB_00156d50;
      }
    }
    else {
      uVar6 = local_a8.bitsConsumed >> 3;
      local_a8.bitsConsumed = local_a8.bitsConsumed & 7;
LAB_00156d50:
      local_a8.ptr = (char *)((long)local_a8.ptr - (ulong)uVar6);
      local_a8.bitContainer = *(size_t *)local_a8.ptr;
    }
    puVar15 = puVar9 + 1;
    puVar9 = puVar9 + 2;
  } while( true );
LAB_00156ede:
  do {
    if ((undefined1 *)(local_70 + -2) < puVar15) {
      return 0xffffffffffffffba;
    }
    lVar12 = local_58.state * 4;
    bVar1 = *(byte *)((long)local_58.table + local_58.state * 4 + 3);
    uVar6 = local_a8.bitsConsumed + bVar1;
    local_58.state =
         ((local_a8.bitContainer << ((byte)local_a8.bitsConsumed & 0x3f)) >> (-bVar1 & 0x3f)) +
         (ulong)*(ushort *)((long)local_58.table + local_58.state * 4);
    puVar9[-1] = *(undefined1 *)((long)local_58.table + lVar12 + 2);
    if (0x40 < uVar6) {
      *puVar9 = *(undefined1 *)((long)local_68.table + local_68.state * 4 + 2);
      puVar9 = puVar9 + 1;
      goto LAB_001570c3;
    }
    if (local_a8.ptr < local_a8.limitPtr) {
      if (local_a8.ptr != local_a8.start) {
        uVar8 = (int)local_a8.ptr - iVar4;
        if (local_a8.start <= (ulong *)((long)local_a8.ptr - (ulong)(uVar6 >> 3))) {
          uVar8 = uVar6 >> 3;
        }
        uVar6 = uVar6 + uVar8 * -8;
        goto LAB_00156f94;
      }
    }
    else {
      uVar8 = uVar6 >> 3;
      uVar6 = uVar6 & 7;
LAB_00156f94:
      local_a8.ptr = (char *)((long)local_a8.ptr - (ulong)uVar8);
      local_a8.bitContainer = *(size_t *)local_a8.ptr;
    }
    if ((undefined1 *)(local_70 + -2) < puVar9) {
      return 0xffffffffffffffba;
    }
    lVar12 = local_68.state * 4;
    bVar1 = *(byte *)((long)local_68.table + local_68.state * 4 + 3);
    local_a8.bitsConsumed = uVar6 + bVar1;
    local_68.state =
         ((local_a8.bitContainer << ((byte)uVar6 & 0x3f)) >> (-bVar1 & 0x3f)) +
         (ulong)*(ushort *)((long)local_68.table + local_68.state * 4);
    *puVar9 = *(undefined1 *)((long)local_68.table + lVar12 + 2);
    if (0x40 < local_a8.bitsConsumed) {
      puVar9[1] = *(undefined1 *)((long)local_58.table + local_58.state * 4 + 2);
      puVar9 = puVar9 + 2;
LAB_001570c3:
      return (long)puVar9 - (long)local_40;
    }
    if (local_a8.ptr < local_a8.limitPtr) {
      if (local_a8.ptr != local_a8.start) {
        uVar6 = (int)local_a8.ptr - iVar4;
        if (local_a8.start <= (ulong *)((long)local_a8.ptr - (ulong)(local_a8.bitsConsumed >> 3))) {
          uVar6 = local_a8.bitsConsumed >> 3;
        }
        local_a8.bitsConsumed = local_a8.bitsConsumed + uVar6 * -8;
        goto LAB_0015700c;
      }
    }
    else {
      uVar6 = local_a8.bitsConsumed >> 3;
      local_a8.bitsConsumed = local_a8.bitsConsumed & 7;
LAB_0015700c:
      local_a8.ptr = (char *)((long)local_a8.ptr - (ulong)uVar6);
      local_a8.bitContainer = *(size_t *)local_a8.ptr;
    }
    puVar15 = puVar9 + 1;
    puVar9 = puVar9 + 2;
  } while( true );
}

Assistant:

size_t FSE_decompress_wksp_bmi2(void* dst, size_t dstCapacity, const void* cSrc, size_t cSrcSize, unsigned maxLog, void* workSpace, size_t wkspSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return FSE_decompress_wksp_body_bmi2(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
    }
#endif
    (void)bmi2;
    return FSE_decompress_wksp_body_default(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
}